

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O1

void __thiscall
Assimp::glTFExporter::GetMatColorOrTex
          (glTFExporter *this,aiMaterial *mat,TexProperty *prop,char *propName,int type,int idx,
          aiTextureType tt)

{
  char *__s;
  _Rb_tree_color _Var1;
  Asset *pAVar2;
  Texture *pTVar3;
  aiTexture **ppaVar4;
  aiTexture *paVar5;
  uint uVar6;
  aiReturn aVar7;
  int iVar8;
  size_t sVar9;
  iterator iVar10;
  mapped_type_conflict3 *pmVar11;
  Ref<glTF::Texture> RVar12;
  Ref<glTF::Image> RVar13;
  string imgId;
  aiColor4D col;
  string mimeType;
  string path;
  string texId;
  aiString tex;
  string local_4c8;
  aiColor4D local_4a8;
  string local_498;
  key_type local_478;
  string local_458;
  aiString local_434;
  
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(local_434.data + 1,0x1b,0x3ff);
  local_4a8.r = 0.0;
  local_4a8.g = 0.0;
  local_4a8.b = 0.0;
  local_4a8.a = 0.0;
  uVar6 = aiGetMaterialTextureCount(mat,tt);
  if ((uVar6 != 0) &&
     (aVar7 = aiGetMaterialString(mat,"$tex.file",tt,0,&local_434), aVar7 == aiReturn_SUCCESS)) {
    __s = local_434.data;
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    sVar9 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,__s,__s + sVar9);
    if (local_478._M_string_length != 0) {
      if ((*local_478._M_dataplus._M_p != '*') &&
         (iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::find(&(this->mTexturesByPath)._M_t,&local_478),
         (_Rb_tree_header *)iVar10._M_node !=
         &(this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header)) {
        _Var1 = iVar10._M_node[2]._M_color;
        (prop->texture).vector =
             &(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              textures).mObjs;
        (prop->texture).index = _Var1;
      }
      if ((prop->texture).vector == (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0
         ) {
        pAVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"");
        glTF::Asset::FindUniqueID(&local_458,pAVar2,&local_4c8,"texture");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p);
        }
        RVar12 = glTF::LazyDict<glTF::Texture>::Create
                           (&((this->mAsset).
                              super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             textures,local_458._M_dataplus._M_p);
        (prop->texture).vector = RVar12.vector;
        (prop->texture).index = RVar12.index;
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[](&this->mTexturesByPath,&local_478);
        *pmVar11 = RVar12.index;
        pAVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"");
        glTF::Asset::FindUniqueID(&local_4c8,pAVar2,&local_498,"image");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        RVar13 = glTF::LazyDict<glTF::Image>::Create
                           (&((this->mAsset).
                              super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             images,local_4c8._M_dataplus._M_p);
        pTVar3 = (((prop->texture).vector)->
                 super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[(prop->texture).index];
        (pTVar3->source).vector = RVar13.vector;
        *(uint *)((long)&pTVar3->source + 8) = RVar13.index;
        if (*local_478._M_dataplus._M_p == '*') {
          ppaVar4 = this->mScene->mTextures;
          iVar8 = atoi(local_478._M_dataplus._M_p + 1);
          paVar5 = ppaVar4[iVar8];
          pTVar3 = (((prop->texture).vector)->
                   super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[(prop->texture).index];
          glTF::Image::SetData
                    (*(Image **)
                      (*(long *)(pTVar3->source).vector +
                      (ulong)*(uint *)((long)&pTVar3->source + 8) * 8),&paVar5->pcData->b,
                     (ulong)paVar5->mWidth,
                     (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          if (paVar5->achFormatHint[0] != '\0') {
            local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"image/","");
            std::__cxx11::string::append((char *)&local_498);
            pTVar3 = (((prop->texture).vector)->
                     super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[(prop->texture).index];
            std::__cxx11::string::_M_assign
                      ((string *)
                       (*(long *)(*(long *)(pTVar3->source).vector +
                                 (ulong)*(uint *)((long)&pTVar3->source + 8) * 8) + 0x78));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p);
            }
          }
        }
        else {
          pTVar3 = (((prop->texture).vector)->
                   super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[(prop->texture).index];
          std::__cxx11::string::_M_assign
                    ((string *)
                     (*(long *)(*(long *)(pTVar3->source).vector +
                               (ulong)*(uint *)((long)&pTVar3->source + 8) * 8) + 0x48));
        }
        GetTexSampler(this,mat,prop);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
  }
  aVar7 = aiGetMaterialColor(mat,propName,type,idx,&local_4a8);
  if (aVar7 == aiReturn_SUCCESS) {
    prop->color[0] = local_4a8.r;
    prop->color[1] = local_4a8.g;
    prop->color[2] = local_4a8.b;
    prop->color[3] = local_4a8.a;
  }
  return;
}

Assistant:

void glTFExporter::GetMatColorOrTex(const aiMaterial* mat, glTF::TexProperty& prop, const char* propName, int type, int idx, aiTextureType tt)
{
    aiString tex;
    aiColor4D col;
    if (mat->GetTextureCount(tt) > 0) {
        if (mat->Get(AI_MATKEY_TEXTURE(tt, 0), tex) == AI_SUCCESS) {
            std::string path = tex.C_Str();

            if (path.size() > 0) {
                if (path[0] != '*') {
                    std::map<std::string, unsigned int>::iterator it = mTexturesByPath.find(path);
                    if (it != mTexturesByPath.end()) {
                        prop.texture = mAsset->textures.Get(it->second);
                    }
                }

                if (!prop.texture) {
                    std::string texId = mAsset->FindUniqueID("", "texture");
                    prop.texture = mAsset->textures.Create(texId);
                    mTexturesByPath[path] = prop.texture.GetIndex();

                    std::string imgId = mAsset->FindUniqueID("", "image");
                    prop.texture->source = mAsset->images.Create(imgId);

                    if (path[0] == '*') { // embedded
                        aiTexture* tex = mScene->mTextures[atoi(&path[1])];

                        uint8_t* data = reinterpret_cast<uint8_t*>(tex->pcData);
                        prop.texture->source->SetData(data, tex->mWidth, *mAsset);

                        if (tex->achFormatHint[0]) {
                            std::string mimeType = "image/";
                            mimeType += (memcmp(tex->achFormatHint, "jpg", 3) == 0) ? "jpeg" : tex->achFormatHint;
                            prop.texture->source->mimeType = mimeType;
                        }
                    }
                    else {
                        prop.texture->source->uri = path;
                    }

                    GetTexSampler(mat, prop);
                }
            }
        }
    }

    if (mat->Get(propName, type, idx, col) == AI_SUCCESS) {
        prop.color[0] = col.r; prop.color[1] = col.g; prop.color[2] = col.b; prop.color[3] = col.a;
    }
}